

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture.cpp
# Opt level: O0

void __thiscall iu_TestFixed2_x_iutest_x_Test2_Test::Body(iu_TestFixed2_x_iutest_x_Test2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_5e0;
  Fixed local_5b0;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c8;
  int local_23c;
  undefined1 local_238 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  int local_3c;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_TestFixed2_x_iutest_x_Test2_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_3c = 2;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"2","x",&local_3c,&TestFixed::x);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
               ,0x43,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    local_23c = 2;
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_238,"2","x",&local_23c,&TestFixed::x);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_238);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
                 ,0x44,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    iutest::detail::AlwaysZero();
    local_424 = 2;
    iutest::internal::backward::EqHelper<false>::Compare<int>
              ((AssertionResult *)local_420,"2","x",&local_424,&TestFixed::x);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_420);
    if (!bVar1) {
      memset(&local_5b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5b0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_420);
      iutest::AssertionHelper::AssertionHelper
                (&local_5e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/fixture.cpp"
                 ,0x45,pcVar2,kWarning);
      iutest::AssertionHelper::operator=(&local_5e0,&local_5b0);
      iutest::AssertionHelper::~AssertionHelper(&local_5e0);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5b0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_420);
  }
  return;
}

Assistant:

IUTEST_F(TestFixed2, Test2)
{
    IUTEST_ASSERT_EQ(2, x);
    IUTEST_EXPECT_EQ(2, x);
    IUTEST_INFORM_EQ(2, x);
}